

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall
SummedArea_NonCellAligned_Test::~SummedArea_NonCellAligned_Test
          (SummedArea_NonCellAligned_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SummedArea, NonCellAligned) {
    std::array<int, 2> dims[] = {{1, 6}, {6, 1}, {12, 19}, {16, 16}, {100, 300}, {49, 2}};
    RNG rng;
    for (const auto d : dims) {
        Array2D<Float> v(d[0], d[1]);

        for (int y = 0; y < v.ySize(); ++y)
            for (int x = 0; x < v.xSize(); ++x)
                v(x, y) = rng.Uniform<int>(32);

        SummedAreaTable sat(v);

        Bounds2f b({rng.Uniform<Float>(), rng.Uniform<Float>()},
                   {rng.Uniform<Float>(), rng.Uniform<Float>()});

        Float sampledSum = 0;
        int nSamples = 100000;
        for (Point2f u : Hammersley2D(nSamples)) {
            Point2f p = b.Lerp(u);
            Point2i pi(p.x * v.xSize(), p.y * v.ySize());
            sampledSum += v[pi];
        }
        Float sampledResult = sampledSum * b.Area() / nSamples;

        double s = sat.Sum(b);
        if (sampledResult != s)
            EXPECT_LT(std::abs((sampledResult - s) / sampledResult), 1e-3f)
                << StringPrintf("sampled %f s %f", sampledResult, s);
    }
}